

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

ImportInfo * __thiscall cmTarget::GetImportInfo(cmTarget *this,string *config)

{
  iterator iVar1;
  ImportInfo *pIVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_bool>
  pVar3;
  string config_upper;
  ImportInfo info;
  value_type entry;
  key_type local_220;
  ImportInfo local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>
  local_118;
  
  if (this->IsImportedTarget == true) {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    if (config->_M_string_length == 0) {
      std::__cxx11::string::assign((char *)&local_220);
    }
    else {
      cmsys::SystemTools::UpperCase(&local_118.first,config);
      std::__cxx11::string::operator=((string *)&local_220,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
            ::find(&(((this->Internal).Pointer)->ImportInfoMap)._M_t,&local_220);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(((this->Internal).Pointer)->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header) {
      local_200.Location._M_dataplus._M_p = (pointer)&local_200.Location.field_2;
      local_200.NoSOName = false;
      local_200.Multiplicity = 0;
      local_200.Location._M_string_length = 0;
      local_200.Location.field_2._M_local_buf[0] = '\0';
      local_200.SOName._M_dataplus._M_p = (pointer)&local_200.SOName.field_2;
      local_200.SOName._M_string_length = 0;
      local_200.SOName.field_2._M_local_buf[0] = '\0';
      local_200.ImportLibrary._M_dataplus._M_p = (pointer)&local_200.ImportLibrary.field_2;
      local_200.ImportLibrary._M_string_length = 0;
      local_200.ImportLibrary.field_2._M_local_buf[0] = '\0';
      local_200.Languages._M_dataplus._M_p = (pointer)&local_200.Languages.field_2;
      local_200.Languages._M_string_length = 0;
      local_200.Languages.field_2._M_local_buf[0] = '\0';
      local_200.Libraries._M_dataplus._M_p = (pointer)&local_200.Libraries.field_2;
      local_200.Libraries._M_string_length = 0;
      local_200.Libraries.field_2._M_local_buf[0] = '\0';
      local_200.LibrariesProp._M_dataplus._M_p = (pointer)&local_200.LibrariesProp.field_2;
      local_200.LibrariesProp._M_string_length = 0;
      local_200.LibrariesProp.field_2._M_local_buf[0] = '\0';
      local_200.SharedDeps._M_dataplus._M_p = (pointer)&local_200.SharedDeps.field_2;
      local_200.SharedDeps._M_string_length = 0;
      local_200.SharedDeps.field_2._M_local_buf[0] = '\0';
      ComputeImportInfo(this,&local_220,&local_200);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::ImportInfo_&,_true>
                (&local_118,&local_220,&local_200);
      pVar3 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>&>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::ImportInfo>>>
                          *)&((this->Internal).Pointer)->ImportInfoMap,&local_118);
      iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>
      ::~pair(&local_118);
      ImportInfo::~ImportInfo(&local_200);
    }
    if (((this->TargetTypeValue == INTERFACE_LIBRARY) ||
        (iVar1._M_node[2]._M_left != (_Base_ptr)0x0)) ||
       (iVar1._M_node[4]._M_left != (_Base_ptr)0x0)) {
      pIVar2 = (ImportInfo *)(iVar1._M_node + 2);
    }
    else {
      pIVar2 = (ImportInfo *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_220);
  }
  else {
    pIVar2 = (ImportInfo *)0x0;
  }
  return pIVar2;
}

Assistant:

cmTarget::ImportInfo const*
cmTarget::GetImportInfo(const std::string& config) const
{
  // There is no imported information for non-imported targets.
  if(!this->IsImported())
    {
    return 0;
    }

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }
  typedef cmTargetInternals::ImportInfoMapType ImportInfoMapType;

  ImportInfoMapType::const_iterator i =
    this->Internal->ImportInfoMap.find(config_upper);
  if(i == this->Internal->ImportInfoMap.end())
    {
    ImportInfo info;
    this->ComputeImportInfo(config_upper, info);
    ImportInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->ImportInfoMap.insert(entry).first;
    }

  if(this->GetType() == INTERFACE_LIBRARY)
    {
    return &i->second;
    }
  // If the location is empty then the target is not available for
  // this configuration.
  if(i->second.Location.empty() && i->second.ImportLibrary.empty())
    {
    return 0;
    }

  // Return the import information.
  return &i->second;
}